

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O2

string * cppcms::impl::make_scgi_header
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *env,size_t addon_size)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  allocator local_71;
  string env_str;
  key_type local_50;
  
  env_str._M_dataplus._M_p = (pointer)&env_str.field_2;
  env_str._M_string_length = 0;
  env_str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&env_str);
  std::__cxx11::string::string((string *)&local_50,"CONTENT_LENGTH",&local_71);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&env->_M_t,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var1 = &(env->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
    std::__cxx11::string::append((char *)&env_str);
    std::__cxx11::string::append((char *)&env_str,0x267ab9);
  }
  else {
    std::__cxx11::string::append((char *)&env_str,*(ulong *)(cVar2._M_node + 1));
    std::__cxx11::string::append((char *)&env_str,*(ulong *)(cVar2._M_node + 2));
  }
  for (p_Var3 = (env->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3 != cVar2._M_node) {
      std::__cxx11::string::append((char *)&env_str,*(ulong *)(p_Var3 + 1));
      std::__cxx11::string::append((char *)&env_str,*(ulong *)(p_Var3 + 2));
    }
  }
  todec_string<unsigned_long>(__return_storage_ptr__,env_str._M_string_length);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&env_str);
  return __return_storage_ptr__;
}

Assistant:

std::string make_scgi_header(std::map<std::string,std::string> const &env,size_t addon_size)
		{
			std::string env_str;
			env_str.reserve(1000);

			std::map<std::string,std::string>::const_iterator cl;

			cl=env.find("CONTENT_LENGTH");
			if(cl!=env.end()) {
				env_str.append(cl->first.c_str(),cl->first.size()+1);
				env_str.append(cl->second.c_str(),cl->second.size()+1);
			}
			else {
				env_str.append("CONTENT_LENGTH");
				env_str.append("\0" "0",3);
			}

			for(std::map<std::string,std::string>::const_iterator p=env.begin();p!=env.end();++p) {
				if(p==cl)
					continue;
				env_str.append(p->first.c_str(),p->first.size()+1);
				env_str.append(p->second.c_str(),p->second.size()+1);
			}
			std::string header=todec_string(env_str.size());
			header+=':';
			header.reserve(header.size()+env_str.size()+addon_size);
			header+=env_str;
			header+=',';
			return header;
		}